

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

pool_ptr<soul::AST::ProcessorInstance> __thiscall
soul::AST::Connection::getProcessorInstance(Connection *this,Expression *e)

{
  ProcessorInstanceRef *pPVar1;
  ConnectionEndpointRef *pCVar2;
  ArrayElementRef *pAVar3;
  DotOperator *pDVar4;
  pool_ptr<soul::AST::ProcessorInstanceRef> pr;
  pool_ptr<soul::AST::ArrayElementRef> local_20;
  
  cast<soul::AST::ProcessorInstanceRef,soul::AST::Expression>((soul *)&local_20,e);
  if (local_20.object != (ArrayElementRef *)0x0) {
    pPVar1 = pool_ptr<soul::AST::ProcessorInstanceRef>::operator->
                       ((pool_ptr<soul::AST::ProcessorInstanceRef> *)&local_20);
    (this->super_ASTObject)._vptr_ASTObject = (_func_int **)pPVar1->processorInstance;
    return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
  }
  cast<soul::AST::ConnectionEndpointRef,soul::AST::Expression>((soul *)&local_20,e);
  if (local_20.object == (ArrayElementRef *)0x0) {
    cast<soul::AST::ArrayElementRef,soul::AST::Expression>((soul *)&local_20,e);
    if (local_20.object == (ArrayElementRef *)0x0) {
      cast<soul::AST::DotOperator,soul::AST::Expression>((soul *)&local_20,e);
      if (local_20.object == (ArrayElementRef *)0x0) goto LAB_0025428b;
      pDVar4 = pool_ptr<soul::AST::DotOperator>::operator->
                         ((pool_ptr<soul::AST::DotOperator> *)&local_20);
      pPVar1 = (ProcessorInstanceRef *)(pDVar4->lhs).object;
    }
    else {
      pAVar3 = pool_ptr<soul::AST::ArrayElementRef>::operator->(&local_20);
      pPVar1 = (ProcessorInstanceRef *)pool_ptr<soul::AST::Expression>::operator*(&pAVar3->object);
    }
  }
  else {
    pCVar2 = pool_ptr<soul::AST::ConnectionEndpointRef>::operator->
                       ((pool_ptr<soul::AST::ConnectionEndpointRef> *)&local_20);
    if ((pCVar2->parentProcessorInstance).object == (ProcessorInstanceRef *)0x0) {
LAB_0025428b:
      (this->super_ASTObject)._vptr_ASTObject = (_func_int **)0x0;
      return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
    }
    pCVar2 = pool_ptr<soul::AST::ConnectionEndpointRef>::operator->
                       ((pool_ptr<soul::AST::ConnectionEndpointRef> *)&local_20);
    pPVar1 = pool_ptr<soul::AST::ProcessorInstanceRef>::operator*(&pCVar2->parentProcessorInstance);
  }
  getProcessorInstance(this,&pPVar1->super_Expression);
  return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

static pool_ptr<ProcessorInstance> getProcessorInstance (Expression& e)
        {
            if (auto pr = cast<ProcessorInstanceRef> (e))    return pr->processorInstance;
            if (auto er = cast<ConnectionEndpointRef> (e))   return er->parentProcessorInstance != nullptr ? getProcessorInstance (*er->parentProcessorInstance) : nullptr;
            if (auto ar = cast<ArrayElementRef> (e))         return getProcessorInstance (*ar->object);
            if (auto dot = cast<DotOperator> (e))            return getProcessorInstance (dot->lhs);

            return {};
        }